

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

void __thiscall GLDrawList::SortWallIntoPlane(GLDrawList *this,SortNode *head,SortNode *sort)

{
  float fVar1;
  int iVar2;
  int iVar3;
  GLDrawItem *pGVar4;
  GLWall *pGVar5;
  GLFlat *pGVar6;
  texcoord *ptVar7;
  double dVar8;
  uint uVar9;
  SortNode *child;
  GLWall *pGVar10;
  float fVar11;
  double dVar12;
  GLWall w;
  GLWall local_170;
  
  dVar8 = ViewPos.Z;
  pGVar4 = (this->drawitems).Array;
  iVar2 = pGVar4[head->itemindex].index;
  pGVar5 = (this->walls).Array;
  pGVar6 = (this->flats).Array;
  iVar3 = pGVar4[sort->itemindex].index;
  fVar11 = pGVar6[iVar2].z;
  dVar12 = (double)fVar11;
  if (((fVar11 < pGVar5[iVar3].ztop[0]) || (fVar11 < pGVar5[iVar3].ztop[1])) &&
     ((pGVar10 = pGVar5 + iVar3, pGVar5[iVar3].zbottom[0] < fVar11 || (pGVar10->zbottom[1] < fVar11)
      ))) {
    GLWall::GLWall(&local_170,pGVar10);
    AddWall(this,&local_170);
    if (((byte)gl.flags & 0x20) != 0) {
      pGVar10->vertcount = 0;
      uVar9 = (this->walls).Count - 1;
      pGVar5 = (this->walls).Array;
      iVar3 = (this->drawitems).Array[sort->itemindex].index;
      fVar11 = pGVar5[iVar3].tcs[1].v;
      fVar1 = pGVar6[iVar2].z;
      fVar11 = ((fVar1 - pGVar5[iVar3].ztop[0]) * (pGVar5[iVar3].tcs[0].v - fVar11)) /
               (pGVar5[iVar3].zbottom[0] - pGVar5[iVar3].ztop[0]) + fVar11;
      if (dVar12 <= dVar8) {
        pGVar5[uVar9].zbottom[0] = fVar1;
        pGVar5[iVar3].ztop[0] = fVar1;
        pGVar5[uVar9].zbottom[1] = fVar1;
        pGVar5[iVar3].ztop[1] = fVar1;
        pGVar5[uVar9].tcs[0].v = fVar11;
        pGVar5[iVar3].tcs[1].v = fVar11;
        pGVar5[uVar9].tcs[3].v = fVar11;
        ptVar7 = pGVar5[iVar3].tcs + 2;
      }
      else {
        pGVar5[iVar3].zbottom[0] = fVar1;
        pGVar5[uVar9].ztop[0] = fVar1;
        pGVar5[iVar3].zbottom[1] = fVar1;
        pGVar5[uVar9].ztop[1] = fVar1;
        pGVar5[iVar3].tcs[3].v = fVar11;
        pGVar5[uVar9].tcs[2].v = fVar11;
        pGVar5[iVar3].tcs[0].v = fVar11;
        ptVar7 = pGVar5[uVar9].tcs + 1;
      }
      ptVar7->v = fVar11;
    }
    child = StaticSortNodeArray::GetNew(&SortNodes);
    *(undefined8 *)child = 0;
    child->parent = (SortNode *)0x0;
    child->next = (SortNode *)0x0;
    child->left = (SortNode *)0x0;
    child->equal = (SortNode *)0x0;
    child->right = (SortNode *)0x0;
    child->itemindex = (this->drawitems).Count - 1;
    SortNode::AddToLeft(head,sort);
    SortNode::AddToRight(head,child);
    return;
  }
  if ((fVar11 <= pGVar5[iVar3].zbottom[0] || ViewPos.Z < dVar12) &&
     (pGVar5[iVar3].ztop[0] <= fVar11 || ViewPos.Z >= dVar12)) {
    SortNode::AddToRight(head,sort);
    return;
  }
  SortNode::AddToLeft(head,sort);
  return;
}

Assistant:

void GLDrawList::SortWallIntoPlane(SortNode * head,SortNode * sort)
{
	GLFlat * fh=&flats[drawitems[head->itemindex].index];
	GLWall * ws=&walls[drawitems[sort->itemindex].index];

	bool ceiling = fh->z > ViewPos.Z;

	if ((ws->ztop[0] > fh->z || ws->ztop[1] > fh->z) && (ws->zbottom[0] < fh->z || ws->zbottom[1] < fh->z))
	{
		// We have to split this wall!

		// WARNING: NEVER EVER push a member of an array onto the array itself.
		// Bad things will happen if the memory must be reallocated!
		GLWall w = *ws;
		AddWall(&w);
	
		// Splitting is done in the shader with clip planes, if available
		if (gl.flags & RFL_NO_CLIP_PLANES)
		{
			GLWall * ws1;
			ws->vertcount = 0;	// invalidate current vertices.
			ws1=&walls[walls.Size()-1];
			ws=&walls[drawitems[sort->itemindex].index];	// may have been reallocated!
			float newtexv = ws->tcs[GLWall::UPLFT].v + ((ws->tcs[GLWall::LOLFT].v - ws->tcs[GLWall::UPLFT].v) / (ws->zbottom[0] - ws->ztop[0])) * (fh->z - ws->ztop[0]);

			// I make the very big assumption here that translucent walls in sloped sectors
			// and 3D-floors never coexist in the same level. If that were the case this
			// code would become extremely more complicated.
			if (!ceiling)
			{
				ws->ztop[1] = ws1->zbottom[1] = ws->ztop[0] = ws1->zbottom[0] = fh->z;
				ws->tcs[GLWall::UPRGT].v = ws1->tcs[GLWall::LORGT].v = ws->tcs[GLWall::UPLFT].v = ws1->tcs[GLWall::LOLFT].v = newtexv;
			}
			else
			{
				ws1->ztop[1] = ws->zbottom[1] = ws1->ztop[0] = ws->zbottom[0] = fh->z;
				ws1->tcs[GLWall::UPLFT].v = ws->tcs[GLWall::LOLFT].v = ws1->tcs[GLWall::UPRGT].v = ws->tcs[GLWall::LORGT].v=newtexv;
			}
		}

		SortNode * sort2 = SortNodes.GetNew();
		memset(sort2, 0, sizeof(SortNode));
		sort2->itemindex = drawitems.Size() - 1;

		head->AddToLeft(sort);
		head->AddToRight(sort2);
	}
	else if ((ws->zbottom[0]<fh->z && !ceiling) || (ws->ztop[0]>fh->z && ceiling))	// completely on the left side
	{
		head->AddToLeft(sort);
	}
	else
	{
		head->AddToRight(sort);
	}

}